

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isGatherOffsetsResultValid<tcu::LookupPrecision,float>
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,int componentNdx,IVec2 (*offsets) [4],Vector<float,_4> *result)

{
  int size;
  int iVar1;
  bool bVar2;
  bool bVar3;
  int i;
  int y;
  int z;
  ulong uVar4;
  ulong uVar5;
  int offNdx;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<float,_4> res;
  Vec4 diff;
  Vector<float,_4> color;
  Vec2 vBounds;
  Vec2 uBounds;
  int local_ac;
  undefined4 local_a0;
  undefined4 local_9c;
  TextureFormat local_98;
  int aiStack_90 [4];
  int local_80;
  int local_7c;
  undefined1 local_78 [32];
  void *local_58;
  undefined8 uStack_50;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar7 = floorf(local_38 + -0.5);
  fVar8 = floorf(local_34 + -0.5);
  fVar9 = floorf(local_40 + -0.5);
  local_ac = (int)fVar9;
  fVar9 = floorf(local_3c + -0.5);
  local_80 = (int)fVar9;
  bVar3 = local_ac <= local_80;
  if (local_ac <= local_80) {
    size = (level->m_size).m_data[0];
    local_7c = (level->m_size).m_data[1];
    local_78._24_8_ = SEXT48(componentNdx);
    iVar1 = (int)fVar7;
    do {
      for (; iVar1 <= (int)fVar8; iVar1 = iVar1 + 1) {
        local_58 = (void *)0x0;
        uStack_50 = 0;
        lVar6 = 0;
        do {
          y = TexVerifierUtil::wrap(sampler->wrapS,(*offsets)[lVar6].m_data[0] + iVar1,size);
          z = TexVerifierUtil::wrap(sampler->wrapT,(*offsets)[lVar6].m_data[1] + local_ac,local_7c);
          if ((((y < 0) || ((level->m_size).m_data[0] <= y)) || (z < 0)) ||
             ((((level->m_size).m_data[1] <= z || (coordZ < 0)) ||
              ((level->m_size).m_data[2] <= coordZ)))) {
            sampleTextureBorder<float>((tcu *)&local_98,&level->m_format,sampler);
          }
          else {
            ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_78,(int)level,y,z);
            bVar2 = isSRGB(level->m_format);
            if (bVar2) {
              sRGBToLinear((tcu *)&local_98,(Vec4 *)local_78);
            }
            else {
              local_98.order = local_78._0_4_;
              local_98.type = local_78._4_4_;
              aiStack_90[0] = local_78._8_4_;
              aiStack_90[1] = local_78._12_4_;
            }
          }
          *(ChannelOrder *)((long)&local_58 + lVar6 * 4) = (&local_98.order)[local_78._24_8_];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        local_98.order = R;
        local_98.type = SNORM_INT8;
        aiStack_90[0] = 0;
        aiStack_90[1] = 0;
        lVar6 = 0;
        do {
          (&local_98.order)[lVar6] =
               (ChannelOrder)(*(float *)((long)&local_58 + lVar6 * 4) - result->m_data[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        local_78._0_4_ = R;
        local_78._4_4_ = SNORM_INT8;
        local_78._8_4_ = 0;
        local_78._12_4_ = 0;
        lVar6 = 0;
        do {
          fVar9 = (float)(&local_98.order)[lVar6];
          fVar10 = -fVar9;
          if (-fVar9 <= fVar9) {
            fVar10 = fVar9;
          }
          *(float *)(local_78 + lVar6 * 4) = fVar10;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        local_9c = 0;
        lVar6 = 0;
        do {
          *(bool *)((long)&local_9c + lVar6) =
               *(float *)(local_78 + lVar6 * 4) <= (prec->colorThreshold).m_data[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        local_a0 = 0;
        lVar6 = 0;
        do {
          *(byte *)((long)&local_a0 + lVar6) = (prec->colorMask).m_data[lVar6] ^ 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        local_98 = (TextureFormat)((ulong)local_98 & 0xffffffff00000000);
        lVar6 = 0;
        do {
          *(byte *)((long)&local_98.order + lVar6) =
               *(byte *)((long)&local_a0 + lVar6) | *(byte *)((long)&local_9c + lVar6);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        if ((undefined1)local_98.order != R) {
          uVar4 = 0xffffffffffffffff;
          do {
            if (uVar4 == 2) {
              uVar5 = 3;
              break;
            }
            uVar5 = uVar4 + 1;
            lVar6 = uVar4 + 2;
            uVar4 = uVar5;
          } while (*(char *)((long)&local_98.order + lVar6) != '\0');
          if (2 < uVar5) {
            return bVar3;
          }
        }
      }
      local_ac = local_ac + 1;
      bVar3 = local_ac <= local_80;
      iVar1 = (int)fVar7;
    } while (local_ac <= local_80);
  }
  return bVar3;
}

Assistant:

static bool isGatherOffsetsResultValid (const ConstPixelBufferAccess&	level,
										const Sampler&					sampler,
										const PrecType&					prec,
										const Vec2&						coord,
										int								coordZ,
										int								componentNdx,
										const IVec2						(&offsets)[4],
										const Vector<ScalarType, 4>&	result)
{
	const Vec2	uBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(), coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			Vector<ScalarType, 4> color;
			for (int offNdx = 0; offNdx < 4; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int x = wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int y = wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				color[offNdx] = lookup<ScalarType>(level, sampler, x, y, coordZ)[componentNdx];
			}

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}